

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

void extra_close_record(ctl_extr_rec *ctl,int ce_size)

{
  int *piVar1;
  extr_rec *peVar2;
  long lVar3;
  int iVar4;
  
  if (0 < ce_size) {
    if ((ctl->use_extr != 0) &&
       (peVar2 = (ctl->isoent->parent->extr_rec_list).current, peVar2 != (extr_rec *)0x0)) {
      piVar1 = &peVar2->offset;
      *piVar1 = *piVar1 + ce_size;
    }
    ctl->cur_len = ctl->cur_len + ce_size;
  }
  iVar4 = 0;
  if (((long)ctl->cur_len & 1U) != 0) {
    lVar3 = (long)ctl->cur_len + 1;
    ctl->cur_len = (int)lVar3;
    iVar4 = -1;
    if (ctl->bp != (uchar *)0x0) {
      ctl->bp[lVar3] = '\0';
    }
  }
  if (ctl->use_extr == 0) {
    ctl->dr_len = ctl->cur_len;
  }
  else if (ctl->ce_ptr != (uchar *)0x0) {
    set_SUSP_CE(ctl->ce_ptr,ctl->extr_loc,ctl->extr_off,iVar4 + ctl->cur_len);
    return;
  }
  return;
}

Assistant:

static void
extra_close_record(struct ctl_extr_rec *ctl, int ce_size)
{
	int padding = 0;

	if (ce_size > 0)
		extra_tell_used_size(ctl, ce_size);
	/* Padding. */
	if (ctl->cur_len & 0x01) {
		ctl->cur_len++;
		if (ctl->bp != NULL)
			ctl->bp[ctl->cur_len] = 0;
		padding = 1;
	}
	if (ctl->use_extr) {
		if (ctl->ce_ptr != NULL)
			set_SUSP_CE(ctl->ce_ptr, ctl->extr_loc,
			    ctl->extr_off, ctl->cur_len - padding);
	} else
		ctl->dr_len = ctl->cur_len;
}